

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,undefined8 x,size_t param_3)

{
  size_t sVar1;
  undefined8 local_30;
  size_t j;
  int *data_local;
  int *x_local;
  View<int,_false,_std::allocator<unsigned_long>_> *v_local;
  
  local_30 = 0;
  j = param_3;
  while( true ) {
    sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,9);
    if (sVar1 <= local_30) break;
    OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::TimesEqual<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(v,x,j);
    sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,9);
    j = sVar1 * 4 + j;
    local_30 = local_30 + 1;
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,9);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,9);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }